

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

Namespace * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Namespace *n)

{
  visitArray<std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (this,&(n->super_ModuleBase).specialisationParams);
  visitArray<std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
            (this,&n->subModules);
  visitArray<std::vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>>
            (this,&(n->super_ModuleBase).structures);
  replaceArray<std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>>
            (this,&(n->super_ModuleBase).usings);
  visitArray<std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>>
            (this,&n->constants);
  replaceArray<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            (this,&n->functions);
  visitArray<std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>>
            (this,&(n->super_ModuleBase).namespaceAliases);
  visitArray<std::vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>>
            (this,&(n->super_ModuleBase).staticAssertions);
  return n;
}

Assistant:

virtual AST::Namespace& visit (AST::Namespace& n)
    {
        visitArray   (n.specialisationParams);
        visitArray   (n.subModules);
        visitArray   (n.structures);
        replaceArray (n.usings);
        visitArray   (n.constants);
        replaceArray (n.functions);
        visitArray   (n.namespaceAliases);
        visitArray   (n.staticAssertions);

        return n;
    }